

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O0

bool __thiscall Memory::RecyclerSweepManager::AdjustPartialHeuristics(RecyclerSweepManager *this)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  ConfigFlagsTable *flags;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t estimatedPartialReusedFreeByteCount;
  double collectFullCollectPressure;
  double uncollectedBytesPressure;
  double ratio;
  double reuseRatio;
  double collectCost;
  size_t newRescanRootBytes;
  size_t estimatedPartialReuseBytes;
  size_t estimatedPartialReuseBlocks;
  size_t freedBytes;
  size_t allocBytes;
  double collectEfficacy;
  RecyclerSweepManager *this_local;
  
  collectEfficacy = (double)this;
  if ((this->recycler->inPartialCollectMode & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x19f,"(recycler->inPartialCollectMode)","recycler->inPartialCollectMode");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->adjustPartialHeuristics & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a0,"(this->adjustPartialHeuristics)","this->adjustPartialHeuristics");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = InPartialCollect(this);
  if ((!bVar3) && ((this->recycler->autoHeap).unusedPartialCollectFreeBytes != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a1,
                       "(this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0)"
                       ,
                       "this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (0x500000 < this->rescanRootBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a4,"(this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes)",
                       "this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (0x1000000 < (this->recycler->autoHeap).unusedPartialCollectFreeBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a5,
                       "(recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes)"
                       ,
                       "recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  freedBytes = GetNewObjectAllocBytes(this);
  if (freedBytes == 0) {
    allocBytes = 0x3ff0000000000000;
    this->partialCollectSmallHeapBlockReuseMinFreeBytes = 0;
  }
  else {
    estimatedPartialReuseBlocks = GetNewObjectFreeBytes(this);
    if (freedBytes < estimatedPartialReuseBlocks) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1b3,"(freedBytes <= allocBytes)","freedBytes <= allocBytes");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    auVar9._8_4_ = (int)(estimatedPartialReuseBlocks >> 0x20);
    auVar9._0_8_ = estimatedPartialReuseBlocks;
    auVar9._12_4_ = 0x45300000;
    auVar15._8_4_ = (int)(freedBytes >> 0x20);
    auVar15._0_8_ = freedBytes;
    auVar15._12_4_ = 0x45300000;
    dVar7 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)estimatedPartialReuseBlocks) - 4503599627370496.0)) /
            ((auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)freedBytes) - 4503599627370496.0));
    if (dVar7 < 0.1) {
      return false;
    }
    allocBytes = (size_t)((dVar7 - 0.1) / 0.9);
    if (1.0 < (double)allocBytes) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1c4,"(collectEfficacy <= 1.0)","collectEfficacy <= 1.0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    uVar5 = (ulong)((double)allocBytes * 4096.0);
    this->partialCollectSmallHeapBlockReuseMinFreeBytes =
         uVar5 | (long)((double)allocBytes * 4096.0 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f;
  }
  (this->recycler->collectionStats).collectEfficacy = (double)allocBytes;
  (this->recycler->collectionStats).partialCollectSmallHeapBlockReuseMinFreeBytes =
       this->partialCollectSmallHeapBlockReuseMinFreeBytes;
  sVar1 = this->reuseHeapBlockCount;
  auVar10._8_4_ = (int)(sVar1 >> 0x20);
  auVar10._0_8_ = sVar1;
  auVar10._12_4_ = 0x45300000;
  dVar7 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) *
          (1.0 - (double)allocBytes);
  uVar5 = (ulong)dVar7;
  estimatedPartialReuseBytes = uVar5 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f;
  newRescanRootBytes = estimatedPartialReuseBytes << 0xc;
  puVar6 = max<unsigned_long>(&this->rescanRootBytes,&newRescanRootBytes);
  uVar5 = *puVar6;
  (this->recycler->collectionStats).estimatedPartialReuseBytes = newRescanRootBytes;
  if (uVar5 < 0x500001) {
    auVar11._8_4_ = (int)(uVar5 >> 0x20);
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = 0x45300000;
    dVar7 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) / 5242880.0;
    (this->recycler->collectionStats).collectCost = dVar7;
    dVar8 = 1.0 - (double)allocBytes;
    uncollectedBytesPressure = dVar7 * (double)allocBytes + dVar8;
    bVar3 = InPartialCollect(this);
    if (bVar3) {
      if ((ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect <
          this->nextPartialUncollectedAllocBytes) {
        return false;
      }
      sVar1 = this->nextPartialUncollectedAllocBytes;
      auVar12._8_4_ = (int)(sVar1 >> 0x20);
      auVar12._0_8_ = sVar1;
      auVar12._12_4_ = 0x45300000;
      dVar7 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
              (double)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect;
      sVar1 = (this->recycler->autoHeap).unusedPartialCollectFreeBytes;
      auVar13._8_4_ = (int)(sVar1 >> 0x20);
      auVar13._0_8_ = sVar1;
      auVar13._12_4_ = 0x45300000;
      dVar7 = (((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / 16777216.0) *
              (1.0 - dVar7) + dVar7;
      uncollectedBytesPressure = uncollectedBytesPressure * (1.0 - dVar7) + dVar7;
    }
    if ((uncollectedBytesPressure < 0.0) || (1.0 < uncollectedBytesPressure)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1f7,"(0.0 <= ratio && ratio <= 1.0)","0.0 <= ratio && ratio <= 1.0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    dVar7 = (double)(RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount - 0x400) *
            uncollectedBytesPressure;
    uVar5 = (ulong)dVar7;
    this->recycler->uncollectedNewPageCountPartialCollect =
         (uVar5 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f) + 0x400;
    if ((this->recycler->uncollectedNewPageCountPartialCollect < 0x400) ||
       ((ulong)RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount <
        this->recycler->uncollectedNewPageCountPartialCollect)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1fe,
                         "(recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount && recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount)"
                         ,
                         "recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount && recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    sVar1 = this->reuseByteCount;
    auVar14._8_4_ = (int)(sVar1 >> 0x20);
    auVar14._0_8_ = sVar1;
    auVar14._12_4_ = 0x45300000;
    dVar8 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * dVar8;
    uVar5 = (ulong)dVar8;
    if (this->recycler->uncollectedNewPageCountPartialCollect * 0x1000 +
        this->nextPartialUncollectedAllocBytes +
        (uVar5 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f) <
        (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect) {
      flags = Recycler::GetRecyclerFlagsTable(this->recycler);
      bVar3 = RecyclerHeuristic::PartialConcurrentNextCollection(uncollectedBytesPressure,flags);
      this->recycler->partialConcurrentNextCollection = bVar3;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
RecyclerSweepManager::AdjustPartialHeuristics()
{
    Assert(recycler->inPartialCollectMode);
    Assert(this->adjustPartialHeuristics);
    Assert(this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0);

    // DoPartialCollectMode should have rejected these already
    Assert(this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes);
    Assert(recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes);

    // Page reuse Heuristics
    double collectEfficacy;
    const size_t allocBytes = this->GetNewObjectAllocBytes();
    if (allocBytes == 0)
    {
        // We may get collections without allocating memory (e.g. unpin heuristics).
        collectEfficacy = 1.0;                                          // assume 100% efficacy
        this->partialCollectSmallHeapBlockReuseMinFreeBytes = 0;    // reuse all pages
    }
    else
    {
        const size_t freedBytes = this->GetNewObjectFreeBytes();
        Assert(freedBytes <= allocBytes);

        collectEfficacy = (double)freedBytes / (double)allocBytes;

        // If we collected less then 10% of the memory, let's not do partial GC.
        // CONSIDER: It may be good to do partial with low efficacy once we have concurrent partial
        // because old object are not getting collected as well, but without concurrent partial, we will have to mark
        // new objects in thread.
        if (collectEfficacy < MinPartialCollectEfficacy)
        {
            return false;
        }

        // Scale the efficacy linearly such that an efficacy of MinPartialCollectEfficacy translates to an adjusted efficacy of
        // 0.0, and an efficacy of 1.0 translates to an adjusted efficacy of 1.0
        collectEfficacy = (collectEfficacy - MinPartialCollectEfficacy) / (1.0 - MinPartialCollectEfficacy);

        Assert(collectEfficacy <= 1.0);
        this->partialCollectSmallHeapBlockReuseMinFreeBytes = (size_t)(AutoSystemInfo::PageSize * collectEfficacy);
    }
#ifdef RECYCLER_STATS
    recycler->collectionStats.collectEfficacy = collectEfficacy;
    recycler->collectionStats.partialCollectSmallHeapBlockReuseMinFreeBytes = this->partialCollectSmallHeapBlockReuseMinFreeBytes;
#endif

    // Blocks which are being reused are likely to be touched again from allocation and contribute to Rescan cost.
    // If there are many of these, adjust rescanRootBytes to account for this.
    const size_t estimatedPartialReuseBlocks = (size_t)((double)this->reuseHeapBlockCount * (1.0 - collectEfficacy));
    const size_t estimatedPartialReuseBytes = estimatedPartialReuseBlocks * AutoSystemInfo::PageSize;

    const size_t newRescanRootBytes = max(this->rescanRootBytes, estimatedPartialReuseBytes);

    RECYCLER_STATS_SET(recycler, estimatedPartialReuseBytes, estimatedPartialReuseBytes);

    // Recheck the rescanRootBytes
    if (newRescanRootBytes > MaxPartialCollectRescanRootBytes)
    {
        return false;
    }

    double collectCost = (double)newRescanRootBytes / MaxPartialCollectRescanRootBytes;

    RECYCLER_STATS_SET(recycler, collectCost, collectCost);

    // Include the efficacy in equal portion, which is related to the cost of marking through new objects.
    // r = c * e + 1 - e;
    const double reuseRatio = 1.0 - collectEfficacy;
    double ratio = collectCost * collectEfficacy + reuseRatio;

    if (this->InPartialCollect())
    {
        // Avoid ratio of uncollectedBytesPressure > 1.0
        if (this->nextPartialUncollectedAllocBytes > RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect)
        {
            return false;
        }

        // Only add full collect pressure if we are doing partial collect,
        // account for the amount of uncollected bytes and unused bytes to increase
        // pressure to do a full GC by rising the partial GC new page heuristic

        double uncollectedBytesPressure = (double)this->nextPartialUncollectedAllocBytes / (double)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect;
        double collectFullCollectPressure =
            (double)recycler->autoHeap.unusedPartialCollectFreeBytes / (double)MaxUnusedPartialCollectFreeBytes
            * (1.0 - uncollectedBytesPressure) + uncollectedBytesPressure;

        ratio = ratio * (1.0 - collectFullCollectPressure) + collectFullCollectPressure;
    }
    Assert(0.0 <= ratio && ratio <= 1.0);

    // Linear scale the partial GC new page heuristic using the ratio calculated
    recycler->uncollectedNewPageCountPartialCollect = MinPartialUncollectedNewPageCount
        + (size_t)((double)(RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount - MinPartialUncollectedNewPageCount) * ratio);

    Assert(recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount &&
        recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

    // If the number of new page to reach the partial heuristics plus the existing uncollectedAllocBytes
    // and the memory we are going to reuse (assume we use it all) is greater then the full GC max size heuristic
    // (with 1M fudge factor), we trigger a full GC anyways, so let's not get into partial GC
    const size_t estimatedPartialReusedFreeByteCount = (size_t)((double)this->reuseByteCount * reuseRatio);
    if (recycler->uncollectedNewPageCountPartialCollect * AutoSystemInfo::PageSize
        + this->nextPartialUncollectedAllocBytes + estimatedPartialReusedFreeByteCount >= RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect)
    {
        return false;
    }

#if ENABLE_CONCURRENT_GC
    recycler->partialConcurrentNextCollection = RecyclerHeuristic::PartialConcurrentNextCollection(ratio, recycler->GetRecyclerFlagsTable());
#endif
    return true;
}